

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O0

RK_S32 decode_vui(HEVCContext *s,HEVCSPS *sps)

{
  PTLCommon *pPVar1;
  MPP_RET MVar2;
  RK_U32 local_cc;
  RK_U32 local_c8;
  RK_U32 _out_36;
  RK_U32 _out_35;
  RK_U32 _out_34;
  RK_U32 _out_33;
  RK_U32 _out_32;
  RK_S32 _out_31;
  RK_S32 _out_30;
  RK_S32 _out_29;
  RK_S32 _out_28;
  RK_S32 _out_27;
  RK_U32 _out_26;
  RK_S32 _out_25;
  RK_S32 _out_24;
  RK_U32 _out_23;
  RK_U32 _out_22;
  RK_U32 _out_21;
  RK_U32 _out_20;
  RK_S32 _out_19;
  RK_S32 _out_18;
  RK_S32 _out_17;
  RK_S32 _out_16;
  RK_U32 _out_15;
  RK_U32 _out_14;
  RK_S32 _out_13;
  RK_S32 _out_12;
  RK_S32 _out_11;
  RK_S32 _out_10;
  RK_S32 _out_9;
  RK_S32 _out_8;
  RK_S32 _out_7;
  RK_S32 _out_6;
  RK_S32 _out_5;
  RK_S32 _out_4;
  RK_S32 _out_3;
  RK_S32 _out_2;
  RK_S32 _out_1;
  RK_S32 RStack_34;
  RK_U8 sar_idx;
  RK_S32 _out;
  RK_S32 sar_present;
  BitReadCtx_t *gb;
  VUI *vui;
  HEVCSPS *sps_local;
  HEVCContext *s_local;
  
  gb = (BitReadCtx_t *)&sps->vui;
  __out = &s->HEVClc->gb;
  vui = (VUI *)sps;
  sps_local = (HEVCSPS *)s;
  if ((h265d_debug & 1) != 0) {
    _mpp_log_l(4,"H265PARSER_PS","Decoding VUI\n",(char *)0x0);
  }
  *(undefined1 *)&gb->prev_two_bytes_ = 2;
  *(undefined1 *)((long)&gb->prev_two_bytes_ + 1) = 2;
  *(undefined1 *)((long)&gb->prev_two_bytes_ + 2) = 2;
  MVar2 = mpp_read_bits(__out,1,&_out_1);
  __out->ret = MVar2;
  if (__out->ret != MPP_OK) {
    return -0x3ec;
  }
  RStack_34 = _out_1;
  if (_out_1 != 0) {
    _out_2._3_1_ = 0;
    MVar2 = mpp_read_bits(__out,8,&_out_3);
    __out->ret = MVar2;
    if (__out->ret != MPP_OK) {
      return -0x3ec;
    }
    _out_2._3_1_ = (byte)_out_3;
    if ((byte)_out_3 < 0x11) {
      gb->data_ = (RK_U8 *)vui_sar[(byte)_out_3];
    }
    else if ((byte)_out_3 == 0xff) {
      MVar2 = mpp_read_bits(__out,0x10,&_out_4);
      __out->ret = MVar2;
      if (__out->ret != MPP_OK) {
        return -0x3ec;
      }
      *(RK_S32 *)&gb->data_ = _out_4;
      MVar2 = mpp_read_bits(__out,0x10,&_out_5);
      __out->ret = MVar2;
      if (__out->ret != MPP_OK) {
        return -0x3ec;
      }
      *(RK_S32 *)((long)&gb->data_ + 4) = _out_5;
    }
    else {
      _mpp_log_l(4,"H265PARSER_PS","Unknown SAR index: %u.\n",(char *)0x0,(ulong)(byte)_out_3);
    }
  }
  MVar2 = mpp_read_bits(__out,1,&_out_6);
  __out->ret = MVar2;
  if (__out->ret == MPP_OK) {
    gb->bytes_left_ = _out_6;
    if (gb->bytes_left_ != 0) {
      MVar2 = mpp_read_bits(__out,1,&_out_7);
      __out->ret = MVar2;
      if (__out->ret != MPP_OK) {
        return -0x3ec;
      }
      *(RK_S32 *)&gb->field_0xc = _out_7;
    }
    MVar2 = mpp_read_bits(__out,1,&_out_8);
    __out->ret = MVar2;
    if (__out->ret == MPP_OK) {
      *(RK_S32 *)&gb->curr_byte_ = _out_8;
      if ((int)gb->curr_byte_ != 0) {
        MVar2 = mpp_read_bits(__out,3,&_out_9);
        __out->ret = MVar2;
        if (__out->ret != MPP_OK) {
          return -0x3ec;
        }
        *(RK_S32 *)((long)&gb->curr_byte_ + 4) = _out_9;
        MVar2 = mpp_read_bits(__out,1,&_out_10);
        __out->ret = MVar2;
        if (__out->ret != MPP_OK) {
          return -0x3ec;
        }
        gb->num_remaining_bits_in_curr_byte_ = _out_10;
        MVar2 = mpp_read_bits(__out,1,&_out_11);
        __out->ret = MVar2;
        if (__out->ret != MPP_OK) {
          return -0x3ec;
        }
        *(RK_S32 *)&gb->field_0x1c = _out_11;
        if (*(int *)&gb->field_0x1c != 0) {
          MVar2 = mpp_read_bits(__out,8,&_out_12);
          __out->ret = MVar2;
          if (__out->ret != MPP_OK) {
            return -0x3ec;
          }
          *(undefined1 *)&gb->prev_two_bytes_ = (undefined1)_out_12;
          MVar2 = mpp_read_bits(__out,8,&_out_13);
          __out->ret = MVar2;
          if (__out->ret != MPP_OK) {
            return -0x3ec;
          }
          *(undefined1 *)((long)&gb->prev_two_bytes_ + 1) = (undefined1)_out_13;
          MVar2 = mpp_read_bits(__out,8,(RK_S32 *)&_out_14);
          __out->ret = MVar2;
          if (__out->ret != MPP_OK) {
            return -0x3ec;
          }
          *(undefined1 *)((long)&gb->prev_two_bytes_ + 2) = (undefined1)_out_14;
          if ((*(char *)((long)&gb->prev_two_bytes_ + 1) == '\x10') ||
             (*(char *)((long)&gb->prev_two_bytes_ + 1) == '\x12')) {
            pPVar1 = sps_local[0xb].ptl.sub_layer_ptl;
            pPVar1[5].profile_compatibility_flag[9] = '\x01';
            pPVar1[5].profile_compatibility_flag[10] = '\0';
            pPVar1[5].profile_compatibility_flag[0xb] = '\0';
            pPVar1[5].profile_compatibility_flag[0xc] = '\0';
          }
          if (0xe < *(byte *)((long)&gb->prev_two_bytes_ + 2)) {
            *(undefined1 *)((long)&gb->prev_two_bytes_ + 2) = 2;
          }
        }
      }
      MVar2 = mpp_read_bits(__out,1,(RK_S32 *)&_out_15);
      __out->ret = MVar2;
      if (__out->ret == MPP_OK) {
        *(RK_U32 *)((long)&gb->prev_two_bytes_ + 4) = _out_15;
        if (*(int *)((long)&gb->prev_two_bytes_ + 4) != 0) {
          MVar2 = mpp_read_ue(__out,(RK_U32 *)&_out_16);
          __out->ret = MVar2;
          if (__out->ret != MPP_OK) {
            return -0x3ec;
          }
          *(RK_S32 *)&gb->emulation_prevention_bytes_ = _out_16;
          MVar2 = mpp_read_ue(__out,(RK_U32 *)&_out_17);
          __out->ret = MVar2;
          if (__out->ret != MPP_OK) {
            return -0x3ec;
          }
          *(RK_S32 *)((long)&gb->emulation_prevention_bytes_ + 4) = _out_17;
        }
        MVar2 = mpp_read_bits(__out,1,&_out_18);
        __out->ret = MVar2;
        if (__out->ret == MPP_OK) {
          gb->used_bits = _out_18;
          MVar2 = mpp_read_bits(__out,1,&_out_19);
          __out->ret = MVar2;
          if (__out->ret == MPP_OK) {
            *(RK_S32 *)&gb->field_0x34 = _out_19;
            MVar2 = mpp_read_bits(__out,1,(RK_S32 *)&_out_20);
            __out->ret = MVar2;
            if (__out->ret == MPP_OK) {
              *(RK_U32 *)&gb->buf = _out_20;
              MVar2 = mpp_read_bits(__out,1,(RK_S32 *)&_out_21);
              __out->ret = MVar2;
              if (__out->ret == MPP_OK) {
                *(RK_U32 *)((long)&gb->buf + 4) = _out_21;
                if (*(int *)((long)&gb->buf + 4) != 0) {
                  MVar2 = mpp_read_ue(__out,&_out_22);
                  __out->ret = MVar2;
                  if (__out->ret != MPP_OK) {
                    return -0x3ec;
                  }
                  gb->buf_len = _out_22;
                  MVar2 = mpp_read_ue(__out,&_out_23);
                  __out->ret = MVar2;
                  if (__out->ret != MPP_OK) {
                    return -0x3ec;
                  }
                  gb->ret = _out_23;
                  MVar2 = mpp_read_ue(__out,(RK_U32 *)&_out_24);
                  __out->ret = MVar2;
                  if (__out->ret != MPP_OK) {
                    return -0x3ec;
                  }
                  gb->prevention_type = _out_24;
                  MVar2 = mpp_read_ue(__out,(RK_U32 *)&_out_25);
                  __out->ret = MVar2;
                  if (__out->ret != MPP_OK) {
                    return -0x3ec;
                  }
                  *(RK_S32 *)&gb->field_0x4c = _out_25;
                  if (vui != (VUI *)0x0) {
                    if (vui->overscan_info_present_flag == 1) {
                      gb->buf_len = gb->buf_len << 1;
                      gb->ret = gb->ret << 1;
                      gb->prevention_type = gb->prevention_type << 1;
                      *(int *)&gb->field_0x4c = *(int *)&gb->field_0x4c << 1;
                    }
                    else if (vui->overscan_info_present_flag == 2) {
                      gb->buf_len = gb->buf_len << 1;
                      gb->ret = gb->ret << 1;
                    }
                  }
                }
                MVar2 = mpp_read_bits(__out,1,(RK_S32 *)&_out_26);
                __out->ret = MVar2;
                if (__out->ret == MPP_OK) {
                  *(RK_U32 *)&gb->update_curbyte = _out_26;
                  if (*(int *)&gb->update_curbyte != 0) {
                    mpp_read_longbits(__out,0x20,(RK_U32 *)((long)&gb->update_curbyte + 4));
                    mpp_read_longbits(__out,0x20,(RK_U32 *)(gb + 1));
                    MVar2 = mpp_read_bits(__out,1,&_out_27);
                    __out->ret = MVar2;
                    if (__out->ret != MPP_OK) {
                      return -0x3ec;
                    }
                    *(RK_S32 *)((long)&gb[1].data_ + 4) = _out_27;
                    if (*(int *)((long)&gb[1].data_ + 4) != 0) {
                      MVar2 = mpp_read_ue(__out,(RK_U32 *)&_out_28);
                      __out->ret = MVar2;
                      if (__out->ret != MPP_OK) {
                        return -0x3ec;
                      }
                      gb[1].bytes_left_ = _out_28;
                    }
                    MVar2 = mpp_read_bits(__out,1,&_out_29);
                    __out->ret = MVar2;
                    if (__out->ret != MPP_OK) {
                      return -0x3ec;
                    }
                    *(RK_S32 *)&gb[1].field_0xc = _out_29;
                    if (*(int *)&gb[1].field_0xc != 0) {
                      decode_hrd((HEVCContext *)sps_local,1,vui->vui_timing_info_present_flag);
                    }
                  }
                  MVar2 = mpp_read_bits(__out,1,&_out_30);
                  __out->ret = MVar2;
                  if (__out->ret == MPP_OK) {
                    *(RK_S32 *)&gb[1].curr_byte_ = _out_30;
                    if ((int)gb[1].curr_byte_ == 0) {
                      return 0;
                    }
                    MVar2 = mpp_read_bits(__out,1,&_out_31);
                    __out->ret = MVar2;
                    if (__out->ret == MPP_OK) {
                      *(RK_S32 *)((long)&gb[1].curr_byte_ + 4) = _out_31;
                      MVar2 = mpp_read_bits(__out,1,(RK_S32 *)&_out_32);
                      __out->ret = MVar2;
                      if (__out->ret == MPP_OK) {
                        gb[1].num_remaining_bits_in_curr_byte_ = _out_32;
                        MVar2 = mpp_read_bits(__out,1,(RK_S32 *)&_out_33);
                        __out->ret = MVar2;
                        if (__out->ret == MPP_OK) {
                          *(RK_U32 *)&gb[1].field_0x1c = _out_33;
                          MVar2 = mpp_read_ue(__out,&_out_34);
                          __out->ret = MVar2;
                          if (__out->ret == MPP_OK) {
                            *(RK_U32 *)&gb[1].prev_two_bytes_ = _out_34;
                            MVar2 = mpp_read_ue(__out,&_out_35);
                            __out->ret = MVar2;
                            if (__out->ret == MPP_OK) {
                              *(RK_U32 *)((long)&gb[1].prev_two_bytes_ + 4) = _out_35;
                              MVar2 = mpp_read_ue(__out,&_out_36);
                              __out->ret = MVar2;
                              if (__out->ret == MPP_OK) {
                                *(RK_U32 *)&gb[1].emulation_prevention_bytes_ = _out_36;
                                MVar2 = mpp_read_ue(__out,&local_c8);
                                __out->ret = MVar2;
                                if (__out->ret == MPP_OK) {
                                  *(RK_U32 *)((long)&gb[1].emulation_prevention_bytes_ + 4) =
                                       local_c8;
                                  MVar2 = mpp_read_ue(__out,&local_cc);
                                  __out->ret = MVar2;
                                  if (__out->ret == MPP_OK) {
                                    gb[1].used_bits = local_cc;
                                    return 0;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return -0x3ec;
}

Assistant:

static RK_S32 decode_vui(HEVCContext *s, HEVCSPS *sps)
{
    VUI *vui          = &sps->vui;
    BitReadCtx_t *gb = &s->HEVClc->gb;
    RK_S32 sar_present;

    h265d_dbg(H265D_DBG_FUNCTION, "Decoding VUI\n");

    vui->colour_primaries = MPP_FRAME_PRI_UNSPECIFIED;
    vui->transfer_characteristic = MPP_FRAME_TRC_UNSPECIFIED;
    vui->matrix_coeffs = MPP_FRAME_SPC_UNSPECIFIED;

    READ_ONEBIT(gb, &sar_present);
    if (sar_present) {
        RK_U8 sar_idx = 0;
        READ_BITS(gb, 8, &sar_idx);
        if (sar_idx < MPP_ARRAY_ELEMS(vui_sar))
            vui->sar = vui_sar[sar_idx];
        else if (sar_idx == 255) {
            READ_BITS(gb, 16, &vui->sar.num);
            READ_BITS(gb, 16, &vui->sar.den);
        } else
            mpp_log("Unknown SAR index: %u.\n", sar_idx);
    }

    READ_ONEBIT(gb, &vui->overscan_info_present_flag);
    if (vui->overscan_info_present_flag)
        READ_ONEBIT(gb, &vui->overscan_appropriate_flag);

    READ_ONEBIT(gb, &vui->video_signal_type_present_flag);
    if (vui->video_signal_type_present_flag) {
        READ_BITS(gb, 3, & vui->video_format);
        READ_ONEBIT(gb, &vui->video_full_range_flag);
        READ_ONEBIT(gb, &vui->colour_description_present_flag);

        if (vui->colour_description_present_flag) {
            READ_BITS(gb, 8, &vui->colour_primaries);
            READ_BITS(gb, 8, &vui->transfer_characteristic);
            READ_BITS(gb, 8, &vui->matrix_coeffs);

            // Set invalid values to "unspecified"
            //  if (vui->colour_primaries >= RKCOL_PRI_NB)
            //      vui->colour_primaries = RKCOL_PRI_UNSPECIFIED;
            //  if (vui->transfer_characteristic >= RKCOL_TRC_NB)
            //      vui->transfer_characteristic = RKCOL_TRC_UNSPECIFIED;
            if (vui->transfer_characteristic == MPP_FRAME_TRC_SMPTEST2084 ||
                vui->transfer_characteristic == MPP_FRAME_TRC_ARIB_STD_B67)
                s->is_hdr = 1;
            if (vui->matrix_coeffs >= MPP_FRAME_SPC_NB)
                vui->matrix_coeffs = MPP_FRAME_SPC_UNSPECIFIED;
        }
    }

    READ_ONEBIT(gb, &vui->chroma_loc_info_present_flag );
    if (vui->chroma_loc_info_present_flag) {
        READ_UE(gb, &vui->chroma_sample_loc_type_top_field);
        READ_UE(gb, &vui->chroma_sample_loc_type_bottom_field);
    }

    READ_ONEBIT(gb, &vui->neutra_chroma_indication_flag);
    READ_ONEBIT(gb, &vui->field_seq_flag);
    READ_ONEBIT(gb, &vui->frame_field_info_present_flag);

    READ_ONEBIT(gb, &vui->default_display_window_flag);
    if (vui->default_display_window_flag) {
        READ_UE(gb, &vui->def_disp_win.left_offset);
        READ_UE(gb, &vui->def_disp_win.right_offset);
        READ_UE(gb, &vui->def_disp_win.top_offset);
        READ_UE(gb, &vui->def_disp_win.bottom_offset);
        if (sps) {
            if (sps->chroma_format_idc == H265_CHROMA_420) {
                vui->def_disp_win.left_offset   *= 2;
                vui->def_disp_win.right_offset  *= 2;
                vui->def_disp_win.top_offset    *= 2;
                vui->def_disp_win.bottom_offset *= 2;
            } else if (sps->chroma_format_idc == H265_CHROMA_422) {
                vui->def_disp_win.left_offset   *= 2;
                vui->def_disp_win.right_offset  *= 2;
            }
        }

#if 0
        if (s->apply_defdispwin &&
            s->h265dctx->flags2 & CODEC_FLAG2_IGNORE_CROP) {
            h265d_dbg(H265D_DBG_SPS,
                      "discarding vui default display window, "
                      "original values are l:%u r:%u t:%u b:%u\n",
                      vui->def_disp_win.left_offset,
                      vui->def_disp_win.right_offset,
                      vui->def_disp_win.top_offset,
                      vui->def_disp_win.bottom_offset);

            vui->def_disp_win.left_offset   =
                vui->def_disp_win.right_offset  =
                    vui->def_disp_win.top_offset    =
                        vui->def_disp_win.bottom_offset = 0;
        }
#endif
    }

    READ_ONEBIT(gb, &vui->vui_timing_info_present_flag);

    if (vui->vui_timing_info_present_flag) {
        mpp_read_longbits(gb, 32, &vui->vui_num_units_in_tick);
        mpp_read_longbits(gb, 32, &vui->vui_time_scale);
        READ_ONEBIT(gb, &vui->vui_poc_proportional_to_timing_flag);
        if (vui->vui_poc_proportional_to_timing_flag)
            READ_UE(gb, &vui->vui_num_ticks_poc_diff_one_minus1);
        READ_ONEBIT(gb, &vui->vui_hrd_parameters_present_flag);
        if (vui->vui_hrd_parameters_present_flag)
            decode_hrd(s, 1, sps->max_sub_layers);
    }

    READ_ONEBIT(gb, &vui->bitstream_restriction_flag);
    if (vui->bitstream_restriction_flag) {
        READ_ONEBIT(gb, &vui->tiles_fixed_structure_flag);
        READ_ONEBIT(gb, &vui->motion_vectors_over_pic_boundaries_flag);
        READ_ONEBIT(gb, &vui->restricted_ref_pic_lists_flag);
        READ_UE(gb, &vui->min_spatial_segmentation_idc);
        READ_UE(gb, &vui->max_bytes_per_pic_denom);
        READ_UE(gb, &vui->max_bits_per_min_cu_denom);
        READ_UE(gb, &vui->log2_max_mv_length_horizontal);
        READ_UE(gb, &vui->log2_max_mv_length_vertical);
    }
    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}